

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O1

void interactor_return_seat(Interactor *itr)

{
  Interactor *pIVar1;
  _Bool _Var2;
  Seat *seat;
  Seat *pSVar3;
  Interactor *pIVar4;
  
  seat = (*itr->vt->get_seat)(itr);
  _Var2 = is_tempseat(seat);
  if (_Var2) {
    pSVar3 = tempseat_get_real(seat);
    (*pSVar3->vt->set_trust_status)(pSVar3,true);
    tempseat_flush(seat);
    (*itr->vt->set_seat)(itr,pSVar3);
    tempseat_free(seat);
    pIVar1 = itr;
    do {
      pIVar4 = pIVar1;
      pIVar1 = pIVar4->parent;
    } while (pIVar1 != (Interactor *)0x0);
    if (pIVar4->last_to_talk != (Interactor *)0x0) {
      interactor_announce(itr);
      return;
    }
  }
  return;
}

Assistant:

void interactor_return_seat(Interactor *itr)
{
    Seat *tempseat = interactor_get_seat(itr);
    if (!is_tempseat(tempseat))
        return;                        /* no-op */

    /*
     * We're about to hand this seat back to the parent Interactor to
     * do its own thing with. It will typically expect to start in the
     * same state as if the seat had never been borrowed, i.e. in the
     * starting trust state.
     *
     * However, this may be overridden by the tempseat_flush call.
     */
    Seat *realseat = tempseat_get_real(tempseat);
    seat_set_trust_status(realseat, true);

    tempseat_flush(tempseat);
    interactor_set_seat(itr, realseat);
    tempseat_free(tempseat);

    /*
     * If we have a parent Interactor, and anyone has ever called
     * interactor_announce, then all Interactors from now on will
     * announce themselves even if they have nothing to say.
     */
    Interactor *itr_top = interactor_toplevel(itr, NULL);
    if (itr_top->last_to_talk)
        interactor_announce(itr);
}